

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_mulsu2_i64_ppc64
               (TCGContext_conflict10 *tcg_ctx,TCGv_i64 rl,TCGv_i64 rh,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGv_i64 rl_00;
  TCGv_i64 rh_00;
  TCGv_i64 ret;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGv_i64 arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 rh_local;
  TCGv_i64 rl_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  rl_00 = tcg_temp_new_i64(tcg_ctx);
  rh_00 = tcg_temp_new_i64(tcg_ctx);
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_mulu2_i64_ppc64(tcg_ctx,rl_00,rh_00,arg1,arg2);
  tcg_gen_sari_i64_ppc64(tcg_ctx,ret,arg1,0x3f);
  tcg_gen_and_i64_ppc64(tcg_ctx,ret,ret,arg2);
  tcg_gen_sub_i64(tcg_ctx,rh,rh_00,ret);
  tcg_gen_mov_i64_ppc64(tcg_ctx,rl,rl_00);
  tcg_temp_free_i64(tcg_ctx,rl_00);
  tcg_temp_free_i64(tcg_ctx,rh_00);
  tcg_temp_free_i64(tcg_ctx,ret);
  return;
}

Assistant:

void tcg_gen_mulsu2_i64(TCGContext *tcg_ctx, TCGv_i64 rl, TCGv_i64 rh, TCGv_i64 arg1, TCGv_i64 arg2)
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_mulu2_i64(tcg_ctx, t0, t1, arg1, arg2);
    /* Adjust for negative input for the signed arg1.  */
    tcg_gen_sari_i64(tcg_ctx, t2, arg1, 63);
    tcg_gen_and_i64(tcg_ctx, t2, t2, arg2);
    tcg_gen_sub_i64(tcg_ctx, rh, t1, t2);
    tcg_gen_mov_i64(tcg_ctx, rl, t0);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}